

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toc.c
# Opt level: O3

int cueify_toc_deserialize(cueify_toc *t,uint8_t *buffer,size_t size)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  
  iVar3 = 3;
  if ((buffer != (uint8_t *)0x0 && t != (cueify_toc *)0x0) && (iVar3 = 6, 3 < size)) {
    uVar6 = (ulong)CONCAT11(*buffer,buffer[1]);
    if ((uVar6 <= size - 2) && (iVar3 = 7, (buffer[1] + 6 & 7) == 0)) {
      iVar3 = 0;
      memset(t,0,0x324);
      *(uint8_t *)t = buffer[2];
      *(uint8_t *)((long)t + 1) = buffer[3];
      if (2 < uVar6) {
        iVar3 = 0;
        pbVar4 = buffer + 5;
        do {
          uVar1 = (uint)pbVar4[1];
          if (pbVar4[1] == 0xaa) {
            uVar1 = 0;
          }
          uVar2 = (ulong)uVar1;
          *(byte *)((long)t + uVar2 * 8 + 4) = *pbVar4 >> 4;
          *(byte *)((long)t + uVar2 * 8 + 5) = *pbVar4 & 0xf;
          uVar1 = *(uint *)(pbVar4 + 3);
          *(uint *)(t + uVar2 + 1) =
               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          pbVar5 = pbVar4 + 7;
          pbVar4 = pbVar4 + 8;
        } while (pbVar5 < buffer + uVar6 + 2);
      }
    }
  }
  return iVar3;
}

Assistant:

int cueify_toc_deserialize(cueify_toc *t, const uint8_t * const buffer,
			   size_t size) {
    cueify_toc_private *toc = (cueify_toc_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    uint8_t offset;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* TOC Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 8 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    memset(toc, 0, sizeof(cueify_toc_private));

    /* First Track Number */
    toc->first_track_number = buffer[2];
    /* Last Track Number */
    toc->last_track_number = buffer[3];

    /* TOC Track Descriptor(s) */
    bp = buffer + 4;
    while (bp < buffer + toc_length + 2) {
	/* Track Number */
	offset = bp[2];
	if (offset == 0xAA) {
	    offset = 0;
	}

	/* Reserved */
	bp++;
	/* ADR */
	toc->tracks[offset].adr = *bp >> 4;
	/* CONTROL */
	toc->tracks[offset].control = *bp & 0xF;
	bp++;
	/* Track Number */
	bp++;
	/* Reserved */
	bp++;
	/* Track Start Address (LBA) */
	toc->tracks[offset].lba = ((bp[0] << 24) |
				   (bp[1] << 16) |
				   (bp[2] << 8)  | 
				   (bp[3]));
	bp += 4;
    }

    return CUEIFY_OK;
}